

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
argstest::PositionalBase::Validate(PositionalBase *this,string *param_1,string *param_2)

{
  int iVar1;
  ostream *poVar2;
  ostringstream problem;
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (((this->super_NamedBase).super_Base.options & Required) != None) {
    iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Option \'",8);
      (*(this->super_NamedBase).super_Base._vptr_Base[0x14])(&local_1b0,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,local_1b0,local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is required",0xd);
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0);
      }
      (this->super_NamedBase).super_Base.error = Required;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_NamedBase).super_Base.errorMsg,(string *)&local_1b0);
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0);
      }
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
    }
  }
  return;
}

Assistant:

bool IsRequired() const noexcept
            {
                return (GetOptions() & Options::Required) != Options::None;
            }